

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O1

string * __thiscall
rest_rpc::rpc_service::router::get_name_by_key_abi_cxx11_
          (string *__return_storage_ptr__,router *this,uint32_t key)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  _Hash_node_base *p_Var5;
  uint32_t uVar6;
  ulong uVar7;
  string *__str;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  
  uVar1 = (this->key2func_name_)._M_h._M_bucket_count;
  uVar7 = (ulong)key % uVar1;
  p_Var8 = (this->key2func_name_)._M_h._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt != key)) {
    while (p_Var8 = p_Var5, p_Var5 = p_Var8->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var5[1]._M_nxt == key)) goto LAB_00172772;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00172772:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var9->_M_nxt;
  }
  if (p_Var5 == (_Hash_node_base *)0x0) {
    cVar4 = '\x01';
    if (9 < key) {
      uVar6 = key;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar6 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_001727ed;
        }
        if (uVar6 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_001727ed;
        }
        if (uVar6 < 10000) goto LAB_001727ed;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_001727ed:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p,
               (uint)__return_storage_ptr__->_M_string_length,key);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var5[2]._M_nxt,
               (long)&(p_Var5[2]._M_nxt)->_M_nxt + (long)&(p_Var5[3]._M_nxt)->_M_nxt);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_name_by_key(uint32_t key) {
    auto it = key2func_name_.find(key);
    if (it != key2func_name_.end()) {
      return it->second;
    }
    return std::to_string(key);
  }